

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O0

void VL4_C(uint8_t *dst)

{
  uint8_t uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int H;
  int G;
  int F;
  int E;
  int D;
  int C;
  int B;
  int A;
  uint8_t *dst_local;
  
  uVar2 = (uint)dst[-0x1f];
  uVar3 = (uint)dst[-0x1e];
  uVar4 = (uint)dst[-0x1d];
  uVar5 = (uint)dst[-0x1c];
  uVar6 = (uint)dst[-0x1b];
  *dst = (uint8_t)((int)(dst[-0x20] + uVar2 + 1) >> 1);
  uVar1 = (uint8_t)((int)(uVar2 + uVar3 + 1) >> 1);
  dst[0x40] = uVar1;
  dst[1] = uVar1;
  uVar1 = (uint8_t)((int)(uVar3 + uVar4 + 1) >> 1);
  dst[0x41] = uVar1;
  dst[2] = uVar1;
  uVar1 = (uint8_t)((int)(uVar4 + uVar5 + 1) >> 1);
  dst[0x42] = uVar1;
  dst[3] = uVar1;
  dst[0x20] = (uint8_t)((int)((uint)dst[-0x20] + uVar2 * 2 + uVar3 + 2) >> 2);
  uVar1 = (uint8_t)((int)(uVar2 + uVar3 * 2 + uVar4 + 2) >> 2);
  dst[0x60] = uVar1;
  dst[0x21] = uVar1;
  uVar1 = (uint8_t)((int)(uVar3 + uVar4 * 2 + uVar5 + 2) >> 2);
  dst[0x61] = uVar1;
  dst[0x22] = uVar1;
  uVar1 = (uint8_t)((int)(uVar4 + uVar5 * 2 + uVar6 + 2) >> 2);
  dst[0x62] = uVar1;
  dst[0x23] = uVar1;
  dst[0x43] = (uint8_t)((int)(uVar5 + uVar6 * 2 + (uint)dst[-0x1a] + 2) >> 2);
  dst[99] = (uint8_t)((int)(uVar6 + (uint)dst[-0x1a] * 2 + (uint)dst[-0x19] + 2) >> 2);
  return;
}

Assistant:

static void VL4_C(uint8_t* dst) {   // Vertical-Left
  const int A = dst[0 - BPS];
  const int B = dst[1 - BPS];
  const int C = dst[2 - BPS];
  const int D = dst[3 - BPS];
  const int E = dst[4 - BPS];
  const int F = dst[5 - BPS];
  const int G = dst[6 - BPS];
  const int H = dst[7 - BPS];
  DST(0, 0) =             AVG2(A, B);
  DST(1, 0) = DST(0, 2) = AVG2(B, C);
  DST(2, 0) = DST(1, 2) = AVG2(C, D);
  DST(3, 0) = DST(2, 2) = AVG2(D, E);

  DST(0, 1) =             AVG3(A, B, C);
  DST(1, 1) = DST(0, 3) = AVG3(B, C, D);
  DST(2, 1) = DST(1, 3) = AVG3(C, D, E);
  DST(3, 1) = DST(2, 3) = AVG3(D, E, F);
              DST(3, 2) = AVG3(E, F, G);
              DST(3, 3) = AVG3(F, G, H);
}